

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t HUF_buildCTable_wksp
                 (HUF_CElt *CTable,uint *count,U32 maxSymbolValue,U32 maxNbBits,void *workSpace,
                 size_t wkspSize)

{
  char *pcVar1;
  byte bVar2;
  byte bVar3;
  short sVar4;
  short sVar5;
  ushort uVar6;
  int pos;
  uint uVar7;
  undefined4 *__s;
  long lVar8;
  ulong uVar9;
  byte bVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  int iVar20;
  uint uVar21;
  int iVar22;
  HUF_CElt *elt;
  uint uVar23;
  ulong uVar24;
  nodeElt *huffNode0;
  uint uVar25;
  bool bVar26;
  size_t sStack_b0;
  U16 nbPerRank [13];
  ushort auStack_58 [16];
  size_t wkspSize_local;
  
  wkspSize_local = wkspSize;
  __s = (undefined4 *)HUF_alignUpWorkspace(workSpace,&wkspSize_local,4);
  if (wkspSize_local < 0x1300) {
    sStack_b0 = 0xffffffffffffffbe;
  }
  else if (maxSymbolValue < 0x100) {
    uVar16 = (ulong)(maxSymbolValue + 1);
    memset(__s,0,0x1300);
    for (uVar24 = 0; uVar16 != uVar24; uVar24 = uVar24 + 1) {
      uVar23 = count[uVar24];
      uVar25 = 0x1f;
      if (uVar23 != 0) {
        for (; uVar23 >> uVar25 == 0; uVar25 = uVar25 - 1) {
        }
      }
      uVar25 = (uVar25 ^ 0xffffffe0) + 0xbe;
      if (uVar23 < 0xa5) {
        uVar25 = uVar23;
      }
      *(short *)(__s + (ulong)uVar25 + 0x400) = *(short *)(__s + (ulong)uVar25 + 0x400) + 1;
    }
    uVar23 = 0xb;
    if (maxNbBits != 0) {
      uVar23 = maxNbBits;
    }
    if (*(short *)(__s + 0x4bf) != 0) {
      __assert_fail("rankPosition[RANK_POSITION_TABLE_SIZE - 1].base == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x3d40,"void HUF_sort(nodeElt *, const unsigned int *, const U32, rankPos *)");
    }
    for (lVar8 = 0x4bf; lVar8 != 0x400; lVar8 = lVar8 + -1) {
      uVar24 = (ulong)((int)lVar8 - 0x401);
      sVar4 = *(short *)(__s + uVar24 + 0x400);
      sVar5 = *(short *)(__s + lVar8);
      *(short *)(__s + uVar24 + 0x400) = sVar4 + sVar5;
      *(short *)((long)__s + uVar24 * 4 + 0x1002) = sVar4 + sVar5;
    }
    for (uVar24 = 0; uVar16 != uVar24; uVar24 = uVar24 + 1) {
      uVar25 = count[uVar24];
      uVar7 = 0x1f;
      if (uVar25 != 0) {
        for (; uVar25 >> uVar7 == 0; uVar7 = uVar7 - 1) {
        }
      }
      uVar7 = (uVar7 ^ 0xffffffe0) + 0xbe;
      if (uVar25 < 0xa5) {
        uVar7 = uVar25;
      }
      uVar6 = *(ushort *)((long)__s + (ulong)uVar7 * 4 + 0x1006);
      *(ushort *)((long)__s + (ulong)uVar7 * 4 + 0x1006) = uVar6 + 1;
      if ((ushort)maxSymbolValue < uVar6) {
        __assert_fail("pos < maxSymbolValue1",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x3d4c,"void HUF_sort(nodeElt *, const unsigned int *, const U32, rankPos *)"
                     );
      }
      __s[(ulong)uVar6 * 2 + 2] = uVar25;
      *(char *)((long)__s + (ulong)uVar6 * 8 + 0xe) = (char)uVar24;
    }
    for (lVar8 = 0x4a5; lVar8 != 0x4bf; lVar8 = lVar8 + 1) {
      uVar6 = *(ushort *)(__s + lVar8);
      iVar15 = (uint)*(ushort *)((long)__s + lVar8 * 4 + 2) - (uint)uVar6;
      if (1 < iVar15) {
        if (maxSymbolValue < uVar6) {
          __assert_fail("bucketStartIdx < maxSymbolValue1",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x3d56,
                        "void HUF_sort(nodeElt *, const unsigned int *, const U32, rankPos *)");
        }
        HUF_simpleQuickSort((nodeElt *)(__s + (ulong)uVar6 * 2 + 2),0,iVar15 + -1);
      }
    }
    uVar24 = 1;
    while (uVar16 != uVar24) {
      lVar8 = uVar24 * 2;
      lVar13 = uVar24 * 2;
      uVar24 = uVar24 + 1;
      if ((uint)__s[lVar13] < (uint)__s[lVar8 + 2]) {
        __assert_fail("HUF_isSorted(huffNode, maxSymbolValue1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x3d5b,"void HUF_sort(nodeElt *, const unsigned int *, const U32, rankPos *)"
                     );
      }
    }
    uVar24 = (ulong)maxSymbolValue;
    uVar16 = uVar24 + 1;
    lVar8 = (uVar24 << 0x20) + 0x10000000000;
    uVar25 = maxSymbolValue + 0xff;
    do {
      uVar7 = uVar25;
      lVar8 = lVar8 + -0x100000000;
      lVar13 = uVar16 * 2;
      uVar16 = uVar16 - 1;
      uVar25 = uVar7 - 1;
    } while (__s[lVar13] == 0);
    __s[0x202] = __s[lVar13] + __s[uVar16 * 2];
    *(undefined2 *)(__s + uVar16 * 2 + 1) = 0x100;
    *(undefined2 *)(__s + uVar16 * 2 + 3) = 0x100;
    lVar8 = lVar8 >> 0x20;
    for (lVar13 = 0x101; lVar13 <= lVar8; lVar13 = lVar13 + 1) {
      __s[lVar13 * 2 + 2] = 0x40000000;
    }
    iVar15 = uVar7 - 0x101;
    *__s = 0x80000000;
    iVar20 = 0x100;
    for (lVar13 = 0x101; lVar13 <= lVar8; lVar13 = lVar13 + 1) {
      uVar7 = __s[(long)iVar15 * 2 + 2];
      uVar18 = __s[(long)iVar20 * 2 + 2];
      iVar17 = (iVar20 + 1) - (uint)(uVar7 < uVar18);
      iVar12 = iVar20;
      if (uVar7 < uVar18) {
        iVar12 = iVar15;
      }
      uVar21 = (uint)(uVar7 < uVar18);
      iVar22 = iVar15 - uVar21;
      uVar7 = __s[(long)iVar22 * 2 + 2];
      uVar18 = __s[(long)iVar17 * 2 + 2];
      iVar20 = (iVar17 + 1) - (uint)(uVar7 < uVar18);
      iVar15 = (iVar15 - uVar21) - (uint)(uVar7 < uVar18);
      if (uVar7 < uVar18) {
        iVar17 = iVar22;
      }
      __s[lVar13 * 2 + 2] = __s[(long)iVar17 * 2 + 2] + __s[(long)iVar12 * 2 + 2];
      *(short *)(__s + (long)iVar17 * 2 + 3) = (short)lVar13;
      *(short *)(__s + (long)iVar12 * 2 + 3) = (short)lVar13;
    }
    *(undefined1 *)((long)__s + lVar8 * 8 + 0xf) = 0;
    for (uVar9 = (ulong)uVar25; 0xff < (int)uVar9; uVar9 = uVar9 - 1) {
      *(char *)((long)__s + uVar9 * 8 + 0xf) =
           *(char *)((long)__s + (ulong)*(ushort *)(__s + uVar9 * 2 + 3) * 8 + 0xf) + '\x01';
    }
    iVar15 = (int)uVar16;
    lVar8 = (long)iVar15;
    if ((long)iVar15 < 0) {
      lVar8 = -1;
    }
    for (lVar13 = 0; lVar8 + 1 != lVar13; lVar13 = lVar13 + 1) {
      *(char *)((long)__s + lVar13 * 8 + 0xf) =
           *(char *)((long)__s + (ulong)*(ushort *)(__s + lVar13 * 2 + 3) * 8 + 0xf) + '\x01';
    }
    bVar2 = *(byte *)((long)__s + (uVar16 & 0xffffffff) * 8 + 0xf);
    iVar20 = bVar2 - uVar23;
    if (uVar23 <= bVar2 && iVar20 != 0) {
      bVar10 = (byte)iVar20;
      iVar20 = 1 << (bVar10 & 0x1f);
      uVar16 = (long)iVar15 + 1;
      uVar25 = 0;
      while (bVar3 = *(byte *)((long)__s + uVar16 * 8 + 7), uVar23 < bVar3) {
        uVar25 = uVar25 + iVar20 + (-1 << (bVar2 - bVar3 & 0x1f));
        *(char *)((long)__s + uVar16 * 8 + 7) = (char)uVar23;
        uVar16 = uVar16 - 1;
      }
      do {
        lVar8 = uVar16 * 8;
        uVar16 = uVar16 - 1;
      } while (uVar23 == *(byte *)((long)__s + lVar8 + 7));
      if ((uVar25 & iVar20 - 1U) != 0) {
        __assert_fail("((U32)totalCost & (baseCost - 1)) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x3c58,"U32 HUF_setMaxHeight(nodeElt *, U32, U32)");
      }
      uVar25 = (int)uVar25 >> (bVar10 & 0x1f);
      if ((int)uVar25 < 1) {
        __assert_fail("totalCost > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x3c5a,"U32 HUF_setMaxHeight(nodeElt *, U32, U32)");
      }
      nbPerRank[8] = 0xf0f0;
      nbPerRank[9] = 0xf0f0;
      nbPerRank[10] = 0xf0f0;
      nbPerRank[0xb] = 0xf0f0;
      nbPerRank[0xc] = 0xf0f0;
      nbPerRank[0] = 0xf0f0;
      nbPerRank[1] = 0xf0f0;
      nbPerRank[2] = 0xf0f0;
      nbPerRank[3] = 0xf0f0;
      nbPerRank[4] = 0xf0f0;
      nbPerRank[5] = 0xf0f0;
      nbPerRank[6] = 0xf0f0;
      nbPerRank[7] = 0xf0f0;
      uVar9 = uVar16 & 0xffffffff;
      uVar7 = uVar23;
      while (iVar20 = (int)uVar9, -1 < iVar20) {
        bVar2 = *(byte *)((long)__s + uVar9 * 8 + 0xf);
        if (bVar2 < uVar7) {
          uVar7 = (uint)bVar2;
          *(int *)(nbPerRank + (ulong)(uVar23 - uVar7) * 2) = iVar20;
        }
        uVar9 = (ulong)(iVar20 - 1);
      }
      do {
        if ((int)uVar25 < 1) {
          uVar7 = nbPerRank._4_4_;
          do {
            iVar20 = uVar7 + 0xf0f0f10;
            iVar12 = 0;
            uVar18 = uVar25;
            while( true ) {
              uVar7 = uVar7 + 1;
              if (-1 < (int)uVar18) goto LAB_0013cc0d;
              if (iVar20 == iVar12) break;
              pcVar1 = (char *)((long)__s + (ulong)uVar7 * 8 + 0xf);
              *pcVar1 = *pcVar1 + -1;
              uVar18 = uVar18 + 1;
              iVar12 = iVar12 + -1;
            }
            iVar20 = (int)uVar16;
            uVar16 = (long)iVar20 + 1;
            uVar7 = iVar20 + 2;
            do {
              lVar8 = uVar16 * 8;
              uVar16 = uVar16 - 1;
              uVar7 = uVar7 - 1;
            } while (uVar23 == *(byte *)((long)__s + lVar8 + 7));
            pcVar1 = (char *)((long)__s + (long)(int)uVar7 * 8 + 0xf);
            *pcVar1 = *pcVar1 + -1;
            uVar25 = (uVar25 - iVar12) + 1;
            if ((long)uVar16 < 0) {
              __assert_fail("n >= 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x3ca8,"U32 HUF_setMaxHeight(nodeElt *, U32, U32)");
            }
          } while( true );
        }
        uVar7 = 0x1f;
        if (uVar25 != 0) {
          for (; uVar25 >> uVar7 == 0; uVar7 = uVar7 - 1) {
          }
        }
        for (uVar9 = (ulong)((uVar7 ^ 0xffffffe0) + 0x21); 1 < uVar9; uVar9 = uVar9 - 1) {
          if (((ulong)*(uint *)(nbPerRank + uVar9 * 2) != 0xf0f0f0f0) &&
             ((*(uint *)(nbPerRank + (ulong)((int)uVar9 - 1) * 2) == 0xf0f0f0f0 ||
              ((uint)__s[(ulong)*(uint *)(nbPerRank + uVar9 * 2) * 2 + 2] <=
               (uint)(__s[(ulong)*(uint *)(nbPerRank + (ulong)((int)uVar9 - 1) * 2) * 2 + 2] * 2))))
             ) goto LAB_0013ccaa;
        }
        uVar9 = 1;
LAB_0013ccaa:
        uVar19 = uVar9 & 0xffffffff;
        if (((uint)uVar9 != 1) && (*(int *)(nbPerRank + uVar19 * 2) == -0xf0f0f10)) {
          __assert_fail("rankLast[nBitsToDecrease] != noSymbol || nBitsToDecrease == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x3c7c,"U32 HUF_setMaxHeight(nodeElt *, U32, U32)");
        }
        uVar14 = 0xd;
        if (0xd < (uint)uVar9) {
          uVar14 = uVar9 & 0xffffffff;
        }
        for (; uVar7 = (uint)uVar14, uVar19 < 0xd; uVar19 = uVar19 + 1) {
          if (*(int *)(nbPerRank + uVar19 * 2) != -0xf0f0f10) {
            uVar7 = (uint)uVar19;
            break;
          }
        }
        uVar18 = *(uint *)(nbPerRank + (ulong)uVar7 * 2);
        uVar9 = (ulong)uVar18;
        if (uVar9 == 0xf0f0f0f0) {
          __assert_fail("rankLast[nBitsToDecrease] != noSymbol",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x3c80,"U32 HUF_setMaxHeight(nodeElt *, U32, U32)");
        }
        uVar11 = uVar7 - 1;
        pcVar1 = (char *)((long)__s + uVar9 * 8 + 0xf);
        *pcVar1 = *pcVar1 + '\x01';
        uVar21 = uVar18;
        if (*(uint *)(nbPerRank + (ulong)uVar11 * 2) != 0xf0f0f0f0) {
          uVar21 = *(uint *)(nbPerRank + (ulong)uVar11 * 2);
        }
        *(uint *)(nbPerRank + (ulong)uVar11 * 2) = uVar21;
        if (uVar9 == 0) {
          uVar18 = 0xf0f0f0f0;
        }
        else {
          uVar18 = uVar18 - 1;
          if (uVar23 - uVar7 != (uint)*(byte *)((long)__s + (ulong)uVar18 * 8 + 0xf)) {
            uVar18 = 0xf0f0f0f0;
          }
        }
        uVar25 = uVar25 + (-1 << ((byte)uVar11 & 0x1f));
        *(uint *)(nbPerRank + (ulong)uVar7 * 2) = uVar18;
      } while( true );
    }
    uVar23 = (uint)bVar2;
LAB_0013cc0d:
    sStack_b0 = 0xffffffffffffffff;
    if (uVar23 < 0xd) {
      nbPerRank[8] = 0;
      nbPerRank[9] = 0;
      nbPerRank[10] = 0;
      nbPerRank[0xb] = 0;
      nbPerRank[0xc] = 0;
      nbPerRank[0] = 0;
      nbPerRank[1] = 0;
      nbPerRank[2] = 0;
      nbPerRank[3] = 0;
      nbPerRank[4] = 0;
      nbPerRank[5] = 0;
      nbPerRank[6] = 0;
      nbPerRank[7] = 0;
      auStack_58[8] = 0;
      auStack_58[9] = 0;
      auStack_58[10] = 0;
      auStack_58[0xb] = 0;
      auStack_58[0xc] = 0;
      auStack_58[0] = 0;
      auStack_58[1] = 0;
      auStack_58[2] = 0;
      auStack_58[3] = 0;
      auStack_58[4] = 0;
      auStack_58[5] = 0;
      auStack_58[6] = 0;
      auStack_58[7] = 0;
      lVar8 = -1;
      if (-1 < (long)iVar15) {
        lVar8 = (long)iVar15;
      }
      for (lVar13 = 0; lVar8 + 1 != lVar13; lVar13 = lVar13 + 1) {
        nbPerRank[*(byte *)((long)__s + lVar13 * 8 + 0xf)] =
             nbPerRank[*(byte *)((long)__s + lVar13 * 8 + 0xf)] + 1;
      }
      uVar6 = 0;
      sStack_b0 = (size_t)uVar23;
      for (uVar16 = sStack_b0; 0 < (long)uVar16; uVar16 = uVar16 - 1) {
        auStack_58[uVar16] = uVar6;
        uVar6 = (ushort)(uVar6 + nbPerRank[uVar16]) >> 1;
      }
      elt = CTable + 1;
      lVar13 = uVar24 + 1;
      for (lVar8 = 0; lVar13 != lVar8; lVar8 = lVar8 + 1) {
        HUF_setNbBits(elt + *(byte *)((long)__s + lVar8 * 8 + 0xe),
                      (ulong)*(byte *)((long)__s + lVar8 * 8 + 0xf));
      }
      while (bVar26 = lVar13 != 0, lVar13 = lVar13 + -1, bVar26) {
        uVar6 = auStack_58[(byte)*elt];
        auStack_58[(byte)*elt] = uVar6 + 1;
        HUF_setValue(elt,(ulong)uVar6);
        elt = elt + 1;
      }
      *CTable = sStack_b0;
    }
  }
  else {
    sStack_b0 = 0xffffffffffffffd2;
  }
  return sStack_b0;
}

Assistant:

size_t
HUF_buildCTable_wksp(HUF_CElt* CTable, const unsigned* count, U32 maxSymbolValue, U32 maxNbBits,
                     void* workSpace, size_t wkspSize)
{
    HUF_buildCTable_wksp_tables* const wksp_tables =
        (HUF_buildCTable_wksp_tables*)HUF_alignUpWorkspace(workSpace, &wkspSize, ZSTD_ALIGNOF(U32));
    nodeElt* const huffNode0 = wksp_tables->huffNodeTbl;
    nodeElt* const huffNode = huffNode0+1;
    int nonNullRank;

    HUF_STATIC_ASSERT(HUF_CTABLE_WORKSPACE_SIZE == sizeof(HUF_buildCTable_wksp_tables));

    DEBUGLOG(5, "HUF_buildCTable_wksp (alphabet size = %u)", maxSymbolValue+1);

    /* safety checks */
    if (wkspSize < sizeof(HUF_buildCTable_wksp_tables))
        return ERROR(workSpace_tooSmall);
    if (maxNbBits == 0) maxNbBits = HUF_TABLELOG_DEFAULT;
    if (maxSymbolValue > HUF_SYMBOLVALUE_MAX)
        return ERROR(maxSymbolValue_tooLarge);
    ZSTD_memset(huffNode0, 0, sizeof(huffNodeTable));

    /* sort, decreasing order */
    HUF_sort(huffNode, count, maxSymbolValue, wksp_tables->rankPosition);
    DEBUGLOG(6, "sorted symbols completed (%zu symbols)", showHNodeSymbols(huffNode, maxSymbolValue+1));

    /* build tree */
    nonNullRank = HUF_buildTree(huffNode, maxSymbolValue);

    /* determine and enforce maxTableLog */
    maxNbBits = HUF_setMaxHeight(huffNode, (U32)nonNullRank, maxNbBits);
    if (maxNbBits > HUF_TABLELOG_MAX) return ERROR(GENERIC);   /* check fit into table */

    HUF_buildCTableFromTree(CTable, huffNode, nonNullRank, maxSymbolValue, maxNbBits);

    return maxNbBits;
}